

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::TimingControlExpressionSyntax::setChild
          (TimingControlExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  logic_error *this_00;
  ExpressionSyntax *local_140;
  TimingControlSyntax *local_138;
  string local_110;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  ExpressionSyntax *local_38;
  ExpressionSyntax *local_30;
  TimingControlSyntax *local_28;
  TimingControlSyntax *local_20;
  size_t local_18;
  size_t index_local;
  TimingControlExpressionSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  if (index == 0) {
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_138 = (TimingControlSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
      local_138 = SyntaxNode::as<slang::syntax::TimingControlSyntax>(pSVar1);
    }
    local_28 = local_138;
    not_null<slang::syntax::TimingControlSyntax*>::
    not_null<slang::syntax::TimingControlSyntax*,void>
              ((not_null<slang::syntax::TimingControlSyntax*> *)&local_20,&local_28);
    (this->timing).ptr = local_20;
  }
  else {
    if (index != 1) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
                 ,&local_d9);
      std::operator+(&local_b8,&local_d8,":");
      std::__cxx11::to_string(&local_110,0x3206);
      std::operator+(&local_98,&local_b8,&local_110);
      std::operator+(&local_78,&local_98,": ");
      std::operator+(&local_58,&local_78,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_58);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_140 = (ExpressionSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
      local_140 = SyntaxNode::as<slang::syntax::ExpressionSyntax>(pSVar1);
    }
    local_38 = local_140;
    not_null<slang::syntax::ExpressionSyntax*>::not_null<slang::syntax::ExpressionSyntax*,void>
              ((not_null<slang::syntax::ExpressionSyntax*> *)&local_30,&local_38);
    (this->expr).ptr = local_30;
  }
  return;
}

Assistant:

void TimingControlExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: timing = child.node() ? &child.node()->as<TimingControlSyntax>() : nullptr; return;
        case 1: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}